

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks_connecter.cpp
# Opt level: O0

void __thiscall
zmq::socks_connecter_t::socks_connecter_t
          (socks_connecter_t *this,io_thread_t *io_thread_,session_base_t *session_,
          options_t *options_,address_t *addr_,address_t *proxy_addr_,bool delayed_start_)

{
  bool bVar1;
  stream_connecter_base_t *in_RCX;
  undefined8 *in_RDI;
  io_thread_t *in_R8;
  session_base_t *in_R9;
  undefined1 in_stack_00000008;
  string *in_stack_00000150;
  address_t *in_stack_00000158;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  undefined8 *puVar2;
  bool in_stack_ffffffffffffffbf;
  address_t *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc8;
  
  stream_connecter_base_t::stream_connecter_base_t
            (in_RCX,in_R8,in_R9,
             (options_t *)
             (CONCAT17(in_stack_00000008,in_stack_ffffffffffffffc8) & 0x1ffffffffffffff),
             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf);
  *in_RDI = &PTR__socks_connecter_t_003ea4d0;
  in_RDI[0xad] = &PTR__socks_connecter_t_003ea5c8;
  socks_greeting_encoder_t::socks_greeting_encoder_t((socks_greeting_encoder_t *)(in_RDI + 0xb9));
  socks_choice_decoder_t::socks_choice_decoder_t((socks_choice_decoder_t *)(in_RDI + 0xdc));
  socks_basic_auth_request_encoder_t::socks_basic_auth_request_encoder_t
            ((socks_basic_auth_request_encoder_t *)(in_RDI + 0xde));
  socks_auth_response_decoder_t::socks_auth_response_decoder_t
            ((socks_auth_response_decoder_t *)(in_RDI + 0x121));
  socks_request_encoder_t::socks_request_encoder_t((socks_request_encoder_t *)(in_RDI + 0x123));
  socks_response_decoder_t::socks_response_decoder_t((socks_response_decoder_t *)(in_RDI + 0x146));
  in_RDI[0x168] = in_R9;
  *(undefined4 *)(in_RDI + 0x169) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0x16a));
  std::__cxx11::string::string((string *)(in_RDI + 0x16e));
  *(undefined4 *)(in_RDI + 0x172) = 0;
  bVar1 = std::operator==(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    puVar2 = (undefined8 *)&stderr;
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_addr->protocol == protocol_name::tcp",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/socks_connecter.cpp"
            ,0x42);
    fflush((FILE *)*puVar2);
    zmq_abort((char *)0x3056b6);
  }
  address_t::to_string(in_stack_00000158,in_stack_00000150);
  return;
}

Assistant:

zmq::socks_connecter_t::socks_connecter_t (class io_thread_t *io_thread_,
                                           class session_base_t *session_,
                                           const options_t &options_,
                                           address_t *addr_,
                                           address_t *proxy_addr_,
                                           bool delayed_start_) :
    stream_connecter_base_t (
      io_thread_, session_, options_, addr_, delayed_start_),
    _proxy_addr (proxy_addr_),
    _auth_method (socks_no_auth_required),
    _status (unplugged)
{
    zmq_assert (_addr->protocol == protocol_name::tcp);
    _proxy_addr->to_string (_endpoint);
}